

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O1

bool_t prf_model_load_with_callback(prf_model_t *model,bfile_t *bfile,prf_cb_t callback)

{
  byte *pbVar1;
  ushort uVar2;
  _func_bool_t_prf_node_t_ptr_prf_state_t_ptr_bfile_t_ptr *p_Var3;
  bool bVar4;
  bool bVar5;
  uint16_t uVar6;
  uint16_t uVar7;
  bool_t bVar8;
  uint32_t uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  undefined8 *id;
  void *pvVar13;
  prf_state_t *state;
  size_t sVar14;
  prf_node_t *node;
  uint8_t *puVar15;
  prf_nodeinfo_t *ppVar16;
  size_t sVar17;
  ulong uVar18;
  char *pcVar19;
  uint uVar20;
  
  id = (undefined8 *)prf_array_init(8,8);
  pvVar13 = prf_array_init(8,8);
  *id = pvVar13;
  state = prf_state_create();
  state->model = model;
  bVar5 = false;
  uVar20 = 0;
  do {
    bVar8 = bf_at_eof(bfile);
    if (bVar8 != 0 || bVar5) {
      if (0 < (int)uVar20) {
        prf_warn(6,"loading model left state on level %d.",(ulong)uVar20);
      }
      prf_state_destroy(state);
      iVar10 = prf_array_count((void *)*id);
      if (iVar10 == 1) {
        model->header = *(prf_node_t **)*id;
        prf_array_free((void *)*id);
        prf_array_free(id);
        return 1;
      }
      uVar20 = prf_array_count((undefined8 *)*id);
      prf_error(8,"model got multiple %d root nodes",(ulong)uVar20);
      return 0;
    }
    sVar14 = bf_get_remaining_length(bfile);
    pcVar19 = "would reach EOF before reading node header.";
    uVar11 = uVar20;
    if (sVar14 < 4) {
LAB_001029c7:
      bVar4 = false;
      prf_error(6,pcVar19);
    }
    else {
      if (model->mempool_id == 0) {
        node = prf_node_create();
        pcVar19 = "could not allocate memory for new node.";
        if (node != (prf_node_t *)0x0) goto LAB_00102a28;
        goto LAB_001029c7;
      }
      node = (prf_node_t *)pool_malloc(model->mempool_id,0x28);
      pcVar19 = "could not allocate memory for new node.";
      if (node == (prf_node_t *)0x0) goto LAB_001029c7;
      prf_node_clear(node);
      pbVar1 = (byte *)((long)&node->flags + 1);
      *pbVar1 = *pbVar1 | 1;
LAB_00102a28:
      uVar6 = bf_peek_uint16_be(bfile);
      node->opcode = uVar6;
      if (uVar6 == 0x17) {
        prf_error(1,"detected continuation (>= 15.7) - unsupported");
      }
      uVar2 = node->opcode;
      if (uVar2 < 0x3230) {
        if ((uVar2 != 0) && (uVar2 != 0xb)) goto LAB_00102ad3;
LAB_00102a7b:
        if ((0 < (int)uVar20) && (uVar2 == 0xb)) goto LAB_00102ad3;
        sVar14 = bf_get_position(bfile);
        sVar17 = bf_get_length(bfile);
        prf_error(1,"bogus node opcode 0x%04x at level %d, location %d/%d",(ulong)(uint)uVar2,
                  (ulong)uVar20,sVar14,sVar17);
        if (uVar20 != 0) {
          prf_error(1,"since level != 0, can\'t assume trailing garbage");
          goto LAB_00102ad3;
        }
        bVar4 = true;
        bVar5 = true;
        uVar11 = 0;
      }
      else {
        if ((uVar2 == 0xa000) || (uVar2 == 0x3230)) goto LAB_00102a7b;
LAB_00102ad3:
        if (node->opcode == 0xb00) {
          uVar9 = bf_get_uint32_be(bfile);
          bf_unget_uint32_be(bfile,((uVar9 & 0xff00) << 8 | uVar9 << 0x18) >> 0x10 |
                                   (uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8) << 0x10);
          uVar6 = bf_peek_uint16_be(bfile);
          node->opcode = uVar6;
        }
        ppVar16 = prf_nodeinfo_get(node->opcode);
        if ((ppVar16 == (prf_nodeinfo_t *)0x0) ||
           (p_Var3 = ppVar16->load_f,
           p_Var3 == (_func_bool_t_prf_node_t_ptr_prf_state_t_ptr_bfile_t_ptr *)0x0)) {
          uVar6 = bf_get_uint16_be(bfile);
          node->opcode = uVar6;
          uVar6 = bf_get_uint16_be(bfile);
          node->length = uVar6;
          sVar14 = bf_get_remaining_length(bfile);
          if ((ulong)uVar6 <= sVar14 + 4) {
            if (4 < node->length) {
              uVar11 = node->length - 4;
              if (model->mempool_id == 0) {
                puVar15 = (uint8_t *)malloc((ulong)uVar11);
                node->data = puVar15;
              }
              else {
                puVar15 = (uint8_t *)pool_malloc(model->mempool_id,uVar11);
                node->data = puVar15;
                pbVar1 = (byte *)((long)&node->flags + 1);
                *pbVar1 = *pbVar1 | 1;
              }
              bf_read(bfile,node->data,node->length - 4);
            }
            goto LAB_00102bed;
          }
          bVar4 = false;
        }
        else {
          state->node = node;
          bVar8 = (*p_Var3)(node,state,bfile);
          if (bVar8 == 0) {
            bVar4 = false;
          }
          else {
LAB_00102bed:
            if (ppVar16 == (prf_nodeinfo_t *)0x0) {
              prf_debug(1,"node loaded: opcode %d, length %d",(ulong)node->opcode,
                        (ulong)node->length);
            }
            else {
              prf_debug(1,"node loaded: \"%s\"",ppVar16->name);
            }
            if ((ppVar16->flags & 0x201) != 0) {
              iVar10 = prf_array_count((void *)id[(int)uVar20]);
              if (*(long *)(*(long *)(id[(int)uVar20] + -8 + (long)iVar10 * 8) + 0x10) == 0) {
                pvVar13 = prf_array_set_count(id,uVar20 + 1);
                id = (undefined8 *)prf_array_append_ptr(pvVar13,(void *)0x0);
                pvVar13 = prf_array_init(8,8);
                id[(long)(int)uVar20 + 1] = pvVar13;
              }
              uVar20 = uVar20 + (ppVar16->flags & 1);
            }
            if ((ppVar16->flags & 0x200) == 0) {
              pvVar13 = prf_array_append_ptr((void *)id[(int)uVar20],node);
              id[(int)uVar20] = pvVar13;
            }
            else {
              pvVar13 = prf_array_append_ptr((void *)id[(long)(int)uVar20 + 1],node);
              id[(long)(int)uVar20 + 1] = pvVar13;
              iVar10 = prf_array_count((void *)id[(int)uVar20]);
              *(undefined8 *)(*(long *)(id[(int)uVar20] + -8 + (long)iVar10 * 8) + 0x10) =
                   id[(long)(int)uVar20 + 1];
              uVar11 = prf_array_count((void *)id[(long)(int)uVar20 + 1]);
              if (0 < (int)uVar11) {
                uVar18 = 0;
                do {
                  *(undefined8 *)(*(long *)(id[(long)(int)uVar20 + 1] + uVar18 * 8) + 0x18) =
                       *(undefined8 *)(id[(int)uVar20] + ((long)iVar10 + -1) * 8);
                  uVar18 = uVar18 + 1;
                } while (uVar11 != uVar18);
              }
            }
            (*callback.func)(node,callback.data);
            bVar4 = true;
            uVar11 = uVar20;
            if ((ppVar16->flags & 2) != 0) {
              iVar10 = prf_array_count((void *)id[(long)(int)uVar20 + -1]);
              *(undefined8 *)(*(long *)(id[(long)(int)uVar20 + -1] + -8 + (long)iVar10 * 8) + 0x10)
                   = id[(int)uVar20];
              uVar12 = prf_array_count((void *)id[(int)uVar20]);
              uVar11 = uVar20 - 1;
              if (0 < (int)uVar12) {
                uVar18 = 0;
                do {
                  *(undefined8 *)(*(long *)(id[(int)uVar20] + uVar18 * 8) + 0x18) =
                       *(undefined8 *)(id[(long)(int)uVar20 + -1] + ((long)iVar10 + -1) * 8);
                  uVar18 = uVar18 + 1;
                } while (uVar12 != uVar18);
              }
            }
          }
        }
      }
    }
    uVar20 = uVar11;
    if (!bVar4) {
      uVar6 = bf_get_uint16_be(bfile);
      uVar7 = bf_get_uint16_be(bfile);
      bf_rewind(bfile,4);
      ppVar16 = prf_nodeinfo_get(uVar6);
      prf_error(9,"could not load model database.");
      if (ppVar16 == (prf_nodeinfo_t *)0x0) {
        prf_error(6,"  failed while loading node with opcode %d, length: %d",(ulong)uVar6,
                  (ulong)uVar7);
      }
      else {
        prf_error(6,"  failed while loading node \"%s\" (%d), length: %d",ppVar16->name,(ulong)uVar6
                  ,(ulong)uVar7);
      }
      pcVar19 = bf_get_filename(bfile);
      sVar14 = bf_get_position(bfile);
      sVar17 = bf_get_length(bfile);
      prf_error(6,"  file: \"%s\", position: %d (of %d)",pcVar19,sVar14,sVar17);
      prf_debug(6,"dumping node data");
      bf_hex_dump(bfile,_stderr,(uint)uVar7,4);
      return 0;
    }
  } while( true );
}

Assistant:

bool_t
prf_model_load_with_callback(
    prf_model_t * model,
    bfile_t * bfile,
    prf_cb_t callback )
{
    /* no recursing */
    prf_node_t *** stack;
    prf_state_t * state;
    int level, garbage;

    assert( model != NULL && bfile != NULL );
    assert( model->header == NULL );

    stack = (prf_node_t ***)prf_array_init( 8, sizeof( prf_node_t ** ) );
    assert( stack != NULL );
    stack[0] = (prf_node_t **)prf_array_init( 8, sizeof( prf_node_t * ) );
    assert( stack[0] != NULL );
    level = 0;
    state = prf_state_create();
    assert( state != NULL );
    state->model = model;

    garbage = FALSE;
    while ( !bf_at_eof(bfile) && !garbage) {
        prf_node_t * node;
        prf_nodeinfo_t * info;

        if ( bf_get_remaining_length( bfile ) < 4 ) {
            prf_error( 6, "would reach EOF before reading node header." );
            goto error;
        }

        if ( model->mempool_id == 0 ) {
            node = prf_node_create();
            if ( node == NULL ) {
                prf_error( 6, "could not allocate memory for new node." );
                goto error;
            }
        } else {
            node = (prf_node_t *)pool_malloc(model->mempool_id, sizeof(prf_node_t));
            if ( node == NULL ) {
                prf_error(6, "could not allocate memory for new node.");
                goto error;
            }
            prf_node_clear(node);
            node->flags |= PRF_NODE_MEMPOOLED;
        }

        /* note that this is just a _peek_ to detect some special cases before reading
           in the node. */
        node->opcode = bf_peek_uint16_be(bfile);

        if ( node->opcode == 23 ) {
          prf_error(1, "detected continuation (>= 15.7) - unsupported");
        }

        if ( node->opcode == 0x0000 ||
             node->opcode == 0xa000 ||
             node->opcode == 0x3230 ||
             node->opcode == 11 ) {
          if ( level > 0 && node->opcode == 0x000b ) {
            /* this exception is ok */
          } else {
            prf_error(1, "bogus node opcode 0x%04x at level %d, location %d/%d",
             node->opcode, level, bf_get_position(bfile), bf_get_length(bfile));
            if ( level == 0 ) {
              garbage = TRUE;
              goto nullskip;
            } else {
              prf_error(1, "since level != 0, can't assume trailing garbage");
              assert(0);
            }
          }
        }

        if ( node->opcode == 0x0b00 ) {
          /* bugfix: this opcode is byteswapped and needs to be flipped.
             we fix it by read in the int32, flip it and then push it back on the stream
             and continue as usual. */
          uint32_t nodedata, temp1, temp2;
          nodedata = bf_get_uint32_be(bfile);
          temp1 = nodedata & 0xff00ff00;
          temp2 = nodedata & 0x00ff00ff;
          nodedata = (temp1 >> 8) | (temp2 << 8);
          bf_unget_uint32_be(bfile, nodedata);
          node->opcode = bf_peek_uint16_be(bfile);
        }

        info = prf_nodeinfo_get( node->opcode );
        if ( (info != NULL) && (info->load_f != NULL) ) {
            state->node = node;
            if ( ! (*(info->load_f))(node, state, bfile) )
                goto error;
        } else { /* unsupported node */
            node->opcode = bf_get_uint16_be( bfile );
            node->length = bf_get_uint16_be( bfile );
            if ( node->length > (bf_get_remaining_length( bfile ) + 4) )
                goto error;
            if ( node->length > 4 ) {
                if ( model->mempool_id == 0 ) {
                    node->data = (uint8_t *)malloc( node->length - 4 );
                } else {
                    node->data = (uint8_t *)pool_malloc( model->mempool_id,
                        node->length - 4 );
                    node->flags |= PRF_NODE_MEMPOOLED;
                }
                assert( node->data != NULL );
                bf_read( bfile, node->data, node->length - 4 );
            }
        }
        if ( info != NULL )
            prf_debug( 1, "node loaded: \"%s\"", info->name );
        else
            prf_debug( 1, "node loaded: opcode %d, length %d", node->opcode,
                node->length );

        assert(info != NULL);
        /* insert the node in the model */
        if ( ((info->flags & PRF_PUSH_NODE) != 0) ||
             ((info->flags & PRF_ANCILLARY) != 0) ) {
            int cnt;
            cnt = prf_array_count( stack[level] );
            if ( (stack[level])[cnt-1]->children == NULL ) {
                stack = (prf_node_t ***)prf_array_set_count( stack, level+1 );
                stack = (prf_node_t ***)prf_array_append_ptr( stack, NULL );
                stack[level+1] = 
		  (prf_node_t **)prf_array_init( 8, sizeof( prf_node_t * ) );
            }
            if ( (info->flags & PRF_PUSH_NODE) != 0 )
                level++;
        }

        if ( (info->flags & PRF_ANCILLARY) != 0 ) {
            int cnt, anodes, i;
            assert( stack[level+1] != NULL );
            stack[level+1] = 
	      (prf_node_t **)prf_array_append_ptr( stack[level+1], node );
            assert( level >= 0 );
            cnt = prf_array_count( stack[level] );
            stack[level][cnt-1]->children = (prf_node_t **) stack[level+1];
            anodes = prf_array_count( stack[level+1] );
            for ( i = 0; i < anodes; i++ )
                stack[level+1][i]->parent = stack[level][cnt-1];
        } else {
            assert( stack[level] != NULL );
            stack[level] = 
	      (prf_node_t **)prf_array_append_ptr( stack[level], node );
        }

        prf_cb_call( callback, node );

        if ( (info->flags & PRF_POP_NODE) != 0 ) {
            int cnt, children, i;
            assert(level > 0);
            cnt = prf_array_count( stack[level-1] );
            stack[level-1][cnt-1]->children = (prf_node_t **) stack[level];
            children = prf_array_count( stack[level] );
            for ( i = 0; i < children; i++ )
                stack[level][i]->parent = stack[level-1][cnt-1];
            level--;
        }
nullskip:
	;
    } /* while ( ! bf_at_eof( bfile ) ) */

    if ( level > 0 )
        prf_warn( 6, "loading model left state on level %d.", level );

    prf_state_destroy( state );
    if ( prf_array_count( stack[0] ) != 1 ) {
        prf_error( 8, "model got multiple %d root nodes",
            prf_array_count( stack[0] ) );
        return FALSE;
    }

    assert( prf_array_count( stack ) > 0 &&
        stack[0] != NULL && prf_array_count( stack[0] ) > 0 );
    model->header = stack[0][0];
    prf_array_free( stack[0] );
    prf_array_free( stack );
    return TRUE;

error:
    do {
        uint16_t opcode;
        uint16_t length;
        prf_nodeinfo_t * info;
        opcode = bf_get_uint16_be( bfile );
        length = bf_get_uint16_be( bfile );
        bf_rewind( bfile, 4 );
        info = prf_nodeinfo_get( opcode );
        prf_error( 9, "could not load model database." );
        if ( info != NULL ) {
            prf_error( 6, "  failed while loading node \"%s\" (%d), length: %d",
                info->name, opcode, length );
        } else {
            prf_error( 6,
                "  failed while loading node with opcode %d, length: %d",
                opcode, length );
        }
        prf_error( 6, "  file: \"%s\", position: %d (of %d)",
            bf_get_filename( bfile ), bf_get_position( bfile ),
            bf_get_length( bfile ) );

        prf_debug( 6, "dumping node data" );
        bf_hex_dump( bfile, stderr, length, 4 );
    } while ( FALSE );
    return FALSE;
}